

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_t.cpp
# Opt level: O0

string_t * __thiscall deci::string_t::ToText_abi_cxx11_(string_t *this)

{
  long in_RSI;
  string_t *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x10));
  return this;
}

Assistant:

std::string string_t::ToText() const {
      return this->val;
    }